

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapeQuad>::HDivPermutation
               (MElementType eltype,TPZVec<long> *ids,TPZVec<int> *permutegather)

{
  int iVar1;
  TPZVec<int> *permgather;
  int *piVar2;
  TPZVec<int> *in_RDX;
  undefined8 in_RSI;
  uint in_EDI;
  TPZVec<long> *in_stack_00000008;
  int transformid;
  TPZVec<long> *in_stack_00000048;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = (int)((ulong)in_RSI >> 0x20);
  permgather = (TPZVec<int> *)(ulong)in_EDI;
  switch(permgather) {
  case (TPZVec<int> *)0x0:
    piVar2 = TPZVec<int>::operator[](in_RDX,0);
    *piVar2 = 0;
    break;
  case (TPZVec<int> *)0x1:
    iVar1 = pztopology::TPZLine::GetTransformId
                      ((TPZVec<long> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                      );
    pztopology::TPZLine::GetSideHDivPermutation(iVar1,permgather);
    break;
  case (TPZVec<int> *)0x2:
    iVar1 = pztopology::TPZTriangle::GetTransformId(in_stack_00000008);
    pztopology::TPZTriangle::GetSideHDivPermutation(iVar1,permgather);
    break;
  case (TPZVec<int> *)0x3:
    pztopology::TPZQuadrilateral::GetTransformId(in_stack_00000048);
    pztopology::TPZQuadrilateral::GetSideHDivPermutation(iVar1,in_RDX);
    break;
  default:
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::HDivPermutation(MElementType eltype, const TPZVec<int64_t> &ids, TPZVec<int> &permutegather)
{
    int transformid;
    switch (eltype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(ids);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(ids);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(ids);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EPoint:
            transformid = 0;
            permutegather[0] = 0;
            break;
        default:
            DebugStop();
            break;
    }

}